

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O3

void test_gej_cmov(secp256k1_gej *a,secp256k1_gej *b)

{
  secp256k1_fe *psVar1;
  secp256k1_fe *a_00;
  secp256k1_fe *r;
  undefined1 *puVar2;
  int *piVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  undefined4 extraout_EAX;
  uint32_t uVar7;
  secp256k1_scratch_space *scratch;
  code *pcVar8;
  byte bVar9;
  long lVar10;
  uint extraout_EDX;
  uint count;
  ulong uVar11;
  long extraout_RDX;
  secp256k1_ge *scratch_00;
  size_t sVar12;
  secp256k1_gej *r_00;
  secp256k1_ge *r_01;
  uint uVar13;
  secp256k1_ge *psVar14;
  secp256k1_strauss_point_state *psVar15;
  uchar *out32;
  secp256k1_sha256 *psVar16;
  secp256k1_gej *psVar17;
  secp256k1_ge *psVar18;
  ulong uVar19;
  secp256k1_ge *psVar20;
  secp256k1_gej *psVar21;
  secp256k1_gej *psVar22;
  ulong uVar23;
  ulong uVar24;
  secp256k1_ge *a_01;
  ulong uVar25;
  code *cb;
  secp256k1_ge *psVar26;
  secp256k1_callback *error_callback;
  secp256k1_sha256 *hash;
  uint uVar27;
  secp256k1_ge *r_02;
  secp256k1_ge *r_03;
  secp256k1_scalar *psVar28;
  secp256k1_ge *r_04;
  secp256k1_ge *a_02;
  secp256k1_sha256 *psVar29;
  bool bVar30;
  undefined1 auVar31 [16];
  ulong uStack_2968;
  secp256k1_strauss_state sStack_2960;
  secp256k1_strauss_point_state sStack_2948;
  secp256k1_fe asStack_2538 [8];
  secp256k1_ge asStack_23b8 [8];
  secp256k1_gej *psStack_2070;
  secp256k1_callback *psStack_2068;
  secp256k1_ge *psStack_2058;
  secp256k1_strauss_point_state *psStack_2050;
  secp256k1_scalar *psStack_2048;
  undefined1 auStack_2030 [8];
  undefined1 auStack_2028 [176];
  secp256k1_gej sStack_1f78;
  secp256k1_gej sStack_1ee0;
  secp256k1_gej sStack_1e48;
  secp256k1_gej sStack_1db0;
  secp256k1_gej sStack_1d18;
  secp256k1_gej asStack_1c80 [2];
  secp256k1_gej asStack_1b00 [5];
  secp256k1_strauss_point_state sStack_17c0;
  secp256k1_scratch_space *psStack_13a8;
  secp256k1_sha256 *psStack_13a0;
  undefined1 *puStack_1398;
  secp256k1_gej *psStack_1390;
  secp256k1_gej *psStack_1388;
  code *pcStack_1380;
  undefined4 uStack_136e;
  undefined2 uStack_136a;
  secp256k1_gej *psStack_1368;
  long lStack_1360;
  undefined1 auStack_1358 [40];
  undefined8 uStack_1330;
  uint64_t uStack_1328;
  uint64_t uStack_1320;
  secp256k1_sha256 sStack_1318;
  secp256k1_sha256 sStack_12a8;
  secp256k1_gej *psStack_1240;
  secp256k1_ge *psStack_1238;
  secp256k1_ge *psStack_1230;
  secp256k1_ge *psStack_1228;
  secp256k1_gej *psStack_1220;
  secp256k1_strauss_point_state *psStack_1218;
  undefined1 auStack_1210 [32];
  undefined1 auStack_11f0 [40];
  secp256k1_ge *psStack_11c8;
  secp256k1_strauss_point_state *psStack_11c0;
  secp256k1_gej sStack_11b8;
  secp256k1_gej sStack_1120;
  secp256k1_gej sStack_1088;
  secp256k1_ge sStack_ff0;
  secp256k1_gej sStack_f88;
  secp256k1_ge asStack_ef0 [3];
  secp256k1_ge asStack_d70 [8];
  secp256k1_strauss_point_state sStack_a30;
  secp256k1_ge *psStack_618;
  secp256k1_ge *psStack_610;
  secp256k1_ge *psStack_608;
  ulong uStack_600;
  secp256k1_ge *psStack_5f8;
  code *pcStack_5f0;
  code *pcStack_5e8;
  uint uStack_5d4;
  int iStack_5d0;
  int iStack_5cc;
  secp256k1_ge *psStack_5c8;
  ulong uStack_5c0;
  secp256k1_ge *psStack_5b8;
  secp256k1_ge *psStack_5b0;
  secp256k1_ge *psStack_5a8;
  secp256k1_ge *psStack_5a0;
  secp256k1_ge *psStack_598;
  secp256k1_ge *psStack_590;
  uint uStack_57c;
  undefined1 auStack_578 [56];
  ulong uStack_540;
  ulong uStack_538;
  ulong uStack_530;
  ulong uStack_528;
  ulong uStack_520;
  undefined1 auStack_518 [72];
  uint64_t uStack_4d0;
  uint64_t uStack_4c8;
  uint64_t uStack_4c0;
  ulong uStack_4b8;
  ulong uStack_4b0;
  secp256k1_ge *psStack_4a0;
  secp256k1_ge *psStack_498;
  uint64_t uStack_490;
  uint64_t uStack_488;
  uint64_t uStack_480;
  uint64_t uStack_478;
  uint64_t uStack_470;
  uint64_t uStack_468;
  uint64_t uStack_460;
  uint64_t uStack_458;
  uint64_t uStack_450;
  undefined1 auStack_448 [56];
  uint64_t uStack_410;
  uint64_t uStack_408;
  uint64_t uStack_400;
  secp256k1_ge *psStack_3f8;
  uint uStack_3f0;
  secp256k1_ge sStack_3d8;
  secp256k1_ge sStack_368;
  secp256k1_gej sStack_2f8;
  secp256k1_fe *psStack_260;
  secp256k1_ge *psStack_258;
  secp256k1_ge *psStack_250;
  secp256k1_ge *psStack_248;
  secp256k1_ge *psStack_240;
  secp256k1_ge *psStack_238;
  undefined1 auStack_228 [92];
  int iStack_1cc;
  undefined1 auStack_1c8 [100];
  int iStack_164;
  secp256k1_ge sStack_160;
  secp256k1_gej *psStack_f8;
  secp256k1_gej *psStack_f0;
  secp256k1_fe *psStack_e8;
  undefined1 *puStack_e0;
  secp256k1_fe *psStack_d8;
  secp256k1_fe *psStack_d0;
  secp256k1_gej sStack_c8;
  
  bVar4 = 0;
  psVar21 = &sStack_c8;
  psVar22 = &sStack_c8;
  psStack_d0 = (secp256k1_fe *)0x14c817;
  memcpy(&sStack_c8,a,0x98);
  psStack_d0 = (secp256k1_fe *)0x14c81f;
  secp256k1_gej_verify(&sStack_c8);
  psStack_d0 = (secp256k1_fe *)0x14c827;
  secp256k1_gej_verify(b);
  psStack_d0 = (secp256k1_fe *)0x14c834;
  secp256k1_fe_cmov(&sStack_c8.x,&b->x,0);
  psVar1 = &b->y;
  psStack_d0 = (secp256k1_fe *)0x14c847;
  secp256k1_fe_cmov(&sStack_c8.y,psVar1,0);
  r = &sStack_c8.z;
  a_00 = &b->z;
  psStack_d0 = (secp256k1_fe *)0x14c85d;
  secp256k1_fe_cmov(r,a_00,0);
  psStack_d0 = (secp256k1_fe *)0x14c865;
  secp256k1_gej_verify(&sStack_c8);
  psStack_d0 = (secp256k1_fe *)0x14c870;
  psVar17 = a;
  iVar5 = gej_xyz_equals_gej(&sStack_c8,a);
  if (iVar5 == 0) {
    psStack_d0 = (secp256k1_fe *)0x14c907;
    test_gej_cmov_cold_2();
  }
  else {
    psStack_d0 = (secp256k1_fe *)0x14c883;
    secp256k1_gej_verify(&sStack_c8);
    psStack_d0 = (secp256k1_fe *)0x14c88b;
    secp256k1_gej_verify(b);
    psStack_d0 = (secp256k1_fe *)0x14c89b;
    secp256k1_fe_cmov(&sStack_c8.x,&b->x,1);
    psStack_d0 = (secp256k1_fe *)0x14c8ad;
    secp256k1_fe_cmov(&sStack_c8.y,psVar1,1);
    psStack_d0 = (secp256k1_fe *)0x14c8bd;
    secp256k1_fe_cmov(r,a_00,1);
    sStack_c8.infinity = sStack_c8.infinity & 0xfffffffeU | b->infinity & 1U;
    psStack_d0 = (secp256k1_fe *)0x14c8e1;
    secp256k1_gej_verify(&sStack_c8);
    psStack_d0 = (secp256k1_fe *)0x14c8ec;
    psVar17 = b;
    iVar5 = gej_xyz_equals_gej(&sStack_c8,b);
    psVar21 = psVar22;
    if (iVar5 != 0) {
      return;
    }
  }
  psStack_d0 = (secp256k1_fe *)gej_xyz_equals_gej;
  test_gej_cmov_cold_1();
  psStack_d0 = a_00;
  psStack_d8 = psVar1;
  puStack_e0 = (undefined1 *)&sStack_c8;
  psStack_e8 = r;
  psStack_f0 = a;
  psStack_f8 = b;
  if ((*(int *)((long)psVar21 + 0x90) != psVar17->infinity) || (*(int *)((long)psVar21 + 0x90) != 0)
     ) {
    return;
  }
  r_02 = (secp256k1_ge *)(auStack_1c8 + 0x38);
  psStack_238 = (secp256k1_ge *)0x14c959;
  memcpy(r_02,psVar21,0x98);
  psVar14 = (secp256k1_ge *)auStack_228;
  psStack_238 = (secp256k1_ge *)0x14c96e;
  memcpy(psVar14,psVar17,0x98);
  psStack_238 = (secp256k1_ge *)0x14c976;
  secp256k1_fe_normalize((secp256k1_fe *)r_02);
  r_04 = &sStack_160;
  psStack_238 = (secp256k1_ge *)0x14c986;
  secp256k1_fe_normalize(&r_04->x);
  psVar1 = &sStack_160.y;
  psStack_238 = (secp256k1_ge *)0x14c996;
  secp256k1_fe_normalize(psVar1);
  psStack_238 = (secp256k1_ge *)0x14c99e;
  secp256k1_fe_normalize((secp256k1_fe *)psVar14);
  psVar26 = (secp256k1_ge *)(auStack_228 + 0x30);
  psStack_238 = (secp256k1_ge *)0x14c9ab;
  secp256k1_fe_normalize((secp256k1_fe *)psVar26);
  r_03 = (secp256k1_ge *)auStack_1c8;
  psStack_238 = (secp256k1_ge *)0x14c9b8;
  secp256k1_fe_normalize((secp256k1_fe *)r_03);
  psStack_238 = (secp256k1_ge *)0x14c9c0;
  secp256k1_fe_verify((secp256k1_fe *)r_02);
  psStack_238 = (secp256k1_ge *)0x14c9c8;
  psVar18 = psVar14;
  secp256k1_fe_verify((secp256k1_fe *)psVar14);
  if (iStack_164 == 0) {
    psStack_238 = (secp256k1_ge *)0x14cacd;
    gej_xyz_equals_gej_cold_6();
LAB_0014cacd:
    psStack_238 = (secp256k1_ge *)0x14cad2;
    gej_xyz_equals_gej_cold_5();
LAB_0014cad2:
    psStack_238 = (secp256k1_ge *)0x14cad7;
    gej_xyz_equals_gej_cold_4();
LAB_0014cad7:
    psStack_238 = (secp256k1_ge *)0x14cadc;
    gej_xyz_equals_gej_cold_3();
LAB_0014cadc:
    psStack_238 = (secp256k1_ge *)0x14cae1;
    gej_xyz_equals_gej_cold_2();
  }
  else {
    if (auStack_228._44_4_ == 0) goto LAB_0014cacd;
    uVar6 = 4;
    do {
      uVar23 = *(ulong *)(auStack_228 + (ulong)uVar6 * 8);
      uVar11 = *(ulong *)(auStack_1c8 + (ulong)uVar6 * 8 + 0x38);
      if (uVar11 >= uVar23 && uVar11 != uVar23) {
        psVar14 = (secp256k1_ge *)0x1;
        goto LAB_0014ca0a;
      }
      if (uVar11 < uVar23) {
        psVar14 = (secp256k1_ge *)0xffffffff;
        goto LAB_0014ca0a;
      }
      bVar30 = uVar6 != 0;
      uVar6 = uVar6 - 1;
    } while (bVar30);
    psVar14 = (secp256k1_ge *)0x0;
LAB_0014ca0a:
    psStack_238 = (secp256k1_ge *)0x14ca12;
    secp256k1_fe_verify(&r_04->x);
    psStack_238 = (secp256k1_ge *)0x14ca1a;
    psVar18 = psVar26;
    secp256k1_fe_verify((secp256k1_fe *)psVar26);
    if (sStack_160.x.normalized == 0) goto LAB_0014cad2;
    if (iStack_1cc == 0) goto LAB_0014cad7;
    uVar6 = 4;
    do {
      uVar23 = *(ulong *)(auStack_228 + (ulong)uVar6 * 8 + 0x30);
      uVar11 = sStack_160.x.n[uVar6];
      if (uVar11 >= uVar23 && uVar11 != uVar23) {
        r_04 = (secp256k1_ge *)0x1;
        goto LAB_0014ca63;
      }
      if (uVar11 < uVar23) {
        r_04 = (secp256k1_ge *)0xffffffff;
        goto LAB_0014ca63;
      }
      bVar30 = uVar6 != 0;
      uVar6 = uVar6 - 1;
    } while (bVar30);
    r_04 = (secp256k1_ge *)0x0;
LAB_0014ca63:
    psStack_238 = (secp256k1_ge *)0x14ca6b;
    secp256k1_fe_verify(psVar1);
    psStack_238 = (secp256k1_ge *)0x14ca73;
    psVar18 = r_03;
    secp256k1_fe_verify((secp256k1_fe *)r_03);
    if (sStack_160.y.normalized == 0) goto LAB_0014cadc;
    if (auStack_1c8._44_4_ != 0) {
      uVar6 = 4;
      do {
        if (sStack_160.y.n[uVar6] != *(uint64_t *)(auStack_1c8 + (ulong)uVar6 * 8)) {
          return;
        }
        bVar30 = uVar6 != 0;
        uVar6 = uVar6 - 1;
      } while (bVar30);
      return;
    }
  }
  psStack_238 = (secp256k1_ge *)test_pre_g_table;
  gej_xyz_equals_gej_cold_1();
  r_01 = &sStack_3d8;
  psStack_590 = (secp256k1_ge *)0x14cb12;
  psStack_4a0 = psVar18;
  psStack_260 = psVar1;
  psStack_258 = psVar26;
  psStack_250 = r_02;
  psStack_248 = r_03;
  psStack_240 = r_04;
  psStack_238 = psVar14;
  secp256k1_ge_from_storage(r_01,(secp256k1_ge_storage *)psVar18);
  psStack_590 = (secp256k1_ge *)0x14cb1a;
  a_01 = r_01;
  iVar5 = secp256k1_ge_is_valid_var(r_01);
  if (iVar5 != 0) {
    psStack_590 = (secp256k1_ge *)0x14cb51;
    secp256k1_gej_set_ge(&sStack_2f8,&sStack_3d8);
    psStack_590 = (secp256k1_ge *)0x14cb5e;
    secp256k1_gej_double_var(&sStack_2f8,&sStack_2f8,(secp256k1_fe *)0x0);
    psStack_590 = (secp256k1_ge *)0x14cb6e;
    secp256k1_ge_set_gej_var((secp256k1_ge *)auStack_448,&sStack_2f8);
    r_01 = (secp256k1_ge *)0x40;
    uStack_57c = auStack_448._40_4_;
    while( true ) {
      uVar6 = uStack_57c;
      psVar20 = (secp256k1_ge *)(ulong)uStack_57c;
      a_02 = (secp256k1_ge *)0x3fffffffffffc;
      psVar14 = (secp256k1_ge *)0xffffffffffff;
      psStack_590 = (secp256k1_ge *)0x14cb8c;
      secp256k1_fe_verify(&sStack_3d8.x);
      psVar18 = (secp256k1_ge *)0x1;
      psStack_590 = (secp256k1_ge *)0x14cb99;
      secp256k1_fe_verify_magnitude(&sStack_3d8.x,1);
      auStack_578._48_8_ = 0x3ffffbfffff0bc - sStack_3d8.x.n[0];
      uStack_540 = 0x3ffffffffffffc - sStack_3d8.x.n[1];
      uStack_538 = 0x3ffffffffffffc - sStack_3d8.x.n[2];
      uStack_530 = 0x3ffffffffffffc - sStack_3d8.x.n[3];
      uStack_528 = 0x3fffffffffffc - sStack_3d8.x.n[4];
      uStack_520._0_4_ = 2;
      uStack_520._4_4_ = 0;
      r_02 = (secp256k1_ge *)(auStack_578 + 0x30);
      psStack_590 = (secp256k1_ge *)0x14cbed;
      secp256k1_fe_verify((secp256k1_fe *)r_02);
      psStack_590 = (secp256k1_ge *)0x14cbf5;
      secp256k1_fe_verify((secp256k1_fe *)r_02);
      a_01 = (secp256k1_ge *)auStack_448;
      psStack_590 = (secp256k1_ge *)0x14cc02;
      secp256k1_fe_verify((secp256k1_fe *)a_01);
      if (0x20 < (int)((int)uStack_520 + uVar6)) break;
      uStack_468 = auStack_448._0_8_;
      uStack_460 = auStack_448._8_8_;
      auStack_578._48_8_ = auStack_578._48_8_ + auStack_448._0_8_;
      uStack_540 = uStack_540 + auStack_448._8_8_;
      uStack_458 = auStack_448._16_8_;
      uStack_450 = auStack_448._24_8_;
      uStack_538 = uStack_538 + auStack_448._16_8_;
      uStack_530 = uStack_530 + auStack_448._24_8_;
      uStack_490 = auStack_448._32_8_;
      uStack_528 = uStack_528 + auStack_448._32_8_;
      uStack_520 = (ulong)((int)uStack_520 + uVar6);
      psStack_590 = (secp256k1_ge *)0x14cc87;
      auStack_518._56_8_ = r_01;
      secp256k1_fe_verify((secp256k1_fe *)r_02);
      psStack_590 = (secp256k1_ge *)0x14cc8f;
      secp256k1_fe_verify((secp256k1_fe *)r_02);
      auStack_578._48_8_ = (uStack_528 >> 0x30) * 0x1000003d1 + auStack_578._48_8_;
      uStack_540 = ((ulong)auStack_578._48_8_ >> 0x34) + uStack_540;
      uStack_538 = (uStack_540 >> 0x34) + uStack_538;
      uVar23 = (uStack_538 >> 0x34) + uStack_530;
      psVar26 = (secp256k1_ge *)0xfffffffffffff;
      uStack_530 = uVar23 & 0xfffffffffffff;
      uStack_528 = (uVar23 >> 0x34) + (uStack_528 & 0xffffffffffff);
      uStack_538 = uStack_538 & 0xfffffffffffff;
      uStack_540 = uStack_540 & 0xfffffffffffff;
      auStack_578._48_8_ = auStack_578._48_8_ & 0xfffffffffffff;
      uStack_520 = CONCAT44(uStack_520._4_4_,1);
      psStack_590 = (secp256k1_ge *)0x14cd1e;
      secp256k1_fe_verify((secp256k1_fe *)r_02);
      psStack_590 = (secp256k1_ge *)0x14cd2e;
      secp256k1_fe_verify(&sStack_3d8.y);
      psVar18 = (secp256k1_ge *)0x1;
      psStack_590 = (secp256k1_ge *)0x14cd3b;
      secp256k1_fe_verify_magnitude(&sStack_3d8.y,1);
      auStack_578._0_8_ = 0x3ffffbfffff0bc - sStack_3d8.y.n[0];
      auStack_578._8_8_ = 0x3ffffffffffffc - sStack_3d8.y.n[1];
      auStack_578._16_8_ = 0x3ffffffffffffc - sStack_3d8.y.n[2];
      auStack_578._24_8_ = 0x3ffffffffffffc - sStack_3d8.y.n[3];
      auStack_578._32_8_ = 0x3fffffffffffc - sStack_3d8.y.n[4];
      auStack_578._40_4_ = 2;
      auStack_578._44_4_ = 0;
      psVar20 = (secp256k1_ge *)auStack_578;
      psStack_590 = (secp256k1_ge *)0x14cd8f;
      secp256k1_fe_verify((secp256k1_fe *)psVar20);
      psStack_590 = (secp256k1_ge *)0x14cd97;
      secp256k1_fe_verify((secp256k1_fe *)psVar20);
      a_01 = (secp256k1_ge *)(auStack_448 + 0x30);
      psStack_590 = (secp256k1_ge *)0x14cda4;
      secp256k1_fe_verify((secp256k1_fe *)a_01);
      uVar6 = uStack_3f0;
      r_01 = (secp256k1_ge *)(ulong)uStack_3f0;
      if (0x20 < (int)(auStack_578._40_4_ + uStack_3f0)) goto LAB_0014d4a1;
      uStack_488 = auStack_448._48_8_;
      uStack_480 = uStack_410;
      auStack_578._0_8_ = auStack_578._0_8_ + auStack_448._48_8_;
      auStack_578._8_8_ = auStack_578._8_8_ + uStack_410;
      uStack_478 = uStack_408;
      uStack_470 = uStack_400;
      auStack_578._16_8_ = auStack_578._16_8_ + uStack_408;
      auStack_578._24_8_ = auStack_578._24_8_ + uStack_400;
      psStack_498 = psStack_3f8;
      auStack_578._32_8_ = (long)(psStack_3f8->x).n + auStack_578._32_8_;
      auStack_578._44_4_ = 0;
      auStack_578._40_4_ = auStack_578._40_4_ + uStack_3f0;
      psStack_590 = (secp256k1_ge *)0x14ce27;
      secp256k1_fe_verify((secp256k1_fe *)psVar20);
      psStack_590 = (secp256k1_ge *)0x14ce2f;
      secp256k1_fe_verify((secp256k1_fe *)psVar20);
      a_02 = (secp256k1_ge *)0x1000003d1;
      auStack_578._0_8_ = ((ulong)auStack_578._32_8_ >> 0x30) * 0x1000003d1 + auStack_578._0_8_;
      auStack_578._8_8_ = ((ulong)auStack_578._0_8_ >> 0x34) + auStack_578._8_8_;
      auStack_578._16_8_ = ((ulong)auStack_578._8_8_ >> 0x34) + auStack_578._16_8_;
      uVar23 = ((ulong)auStack_578._16_8_ >> 0x34) + auStack_578._24_8_;
      auStack_578._24_8_ = uVar23 & 0xfffffffffffff;
      auStack_578._32_8_ = (uVar23 >> 0x34) + (auStack_578._32_8_ & 0xffffffffffff);
      auStack_578._16_8_ = auStack_578._16_8_ & 0xfffffffffffff;
      auStack_578._8_8_ = auStack_578._8_8_ & 0xfffffffffffff;
      auStack_578._0_8_ = auStack_578._0_8_ & 0xfffffffffffff;
      auStack_578._40_4_ = 1;
      psStack_590 = (secp256k1_ge *)0x14ceb4;
      secp256k1_fe_verify((secp256k1_fe *)psVar20);
      psStack_590 = (secp256k1_ge *)0x14cebc;
      secp256k1_fe_verify((secp256k1_fe *)r_02);
      uVar23 = (uStack_528 >> 0x30) * 0x1000003d1 + auStack_578._48_8_;
      r_02 = (secp256k1_ge *)0xffffefffffc2f;
      if (((uVar23 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar23 & 0xfffffffffffff) == 0)) {
        uVar11 = (uVar23 >> 0x34) + uStack_540;
        uVar19 = (uVar11 >> 0x34) + uStack_538;
        uVar24 = (uVar19 >> 0x34) + uStack_530;
        uVar25 = (uVar24 >> 0x34) + (uStack_528 & 0xffffffffffff);
        if ((((uVar11 | uVar23 | uVar19 | uVar24) & 0xfffffffffffff) != 0 || uVar25 != 0) &&
           ((uVar23 + 0x1000003d0 & uVar11 & uVar19 & uVar24 & (uVar25 ^ 0xf000000000000)) !=
            0xfffffffffffff)) goto LAB_0014d046;
        psStack_590 = (secp256k1_ge *)0x14cf84;
        secp256k1_fe_verify((secp256k1_fe *)auStack_578);
        uVar23 = ((ulong)auStack_578._32_8_ >> 0x30) * 0x1000003d1 + auStack_578._0_8_;
        if (((uVar23 & 0xfffffffffffff) != 0xffffefffffc2f) && ((uVar23 & 0xfffffffffffff) != 0))
        goto LAB_0014d046;
        uVar11 = (uVar23 >> 0x34) + auStack_578._8_8_;
        psVar18 = (secp256k1_ge *)((uVar11 >> 0x34) + auStack_578._16_8_);
        a_01 = (secp256k1_ge *)(((ulong)psVar18 >> 0x34) + auStack_578._24_8_);
        uVar19 = ((ulong)a_01 >> 0x34) + (auStack_578._32_8_ & 0xffffffffffff);
        r_03 = psVar20;
        r_04 = a_02;
        if ((((uVar11 | uVar23 | (ulong)psVar18 | (ulong)a_01) & 0xfffffffffffff) != 0 ||
             uVar19 != 0) &&
           ((uVar23 + 0x1000003d0 & uVar11 & (ulong)psVar18 & (ulong)a_01 &
            (uVar19 ^ 0xf000000000000)) != 0xfffffffffffff)) goto LAB_0014d046;
        goto LAB_0014d4bf;
      }
LAB_0014d046:
      psVar18 = (secp256k1_ge *)
                ((long)(psStack_4a0->x).n + (long)((secp256k1_fe *)auStack_518._56_8_)->n);
      psVar26 = &sStack_368;
      psStack_590 = (secp256k1_ge *)0x14d06a;
      secp256k1_ge_from_storage(psVar26,(secp256k1_ge_storage *)psVar18);
      psStack_590 = (secp256k1_ge *)0x14d072;
      a_01 = psVar26;
      iVar5 = secp256k1_ge_is_valid_var(psVar26);
      if (iVar5 == 0) goto LAB_0014d4a6;
      psStack_590 = (secp256k1_ge *)0x14d082;
      secp256k1_fe_verify(&psVar26->x);
      psVar18 = (secp256k1_ge *)0x1;
      psStack_590 = (secp256k1_ge *)0x14d08f;
      secp256k1_fe_verify_magnitude(&psVar26->x,1);
      auStack_518._0_8_ = 0x3ffffbfffff0bc - sStack_368.x.n[0];
      auStack_518._8_8_ = 0x3ffffffffffffc - sStack_368.x.n[1];
      auStack_518._16_8_ = 0x3ffffffffffffc - sStack_368.x.n[2];
      auStack_518._24_8_ = 0x3ffffffffffffc - sStack_368.x.n[3];
      auStack_518._32_8_ = 0x3fffffffffffc - sStack_368.x.n[4];
      auStack_518._40_8_ = 2;
      psVar14 = (secp256k1_ge *)auStack_518;
      psStack_590 = (secp256k1_ge *)0x14d0f3;
      secp256k1_fe_verify((secp256k1_fe *)psVar14);
      psStack_590 = (secp256k1_ge *)0x14d0fb;
      secp256k1_fe_verify((secp256k1_fe *)psVar14);
      a_01 = (secp256k1_ge *)auStack_448;
      psStack_590 = (secp256k1_ge *)0x14d108;
      secp256k1_fe_verify((secp256k1_fe *)a_01);
      r_03 = psStack_498;
      if (0x20 < (int)(auStack_518._40_4_ + uStack_57c)) goto LAB_0014d4ab;
      psVar26 = (secp256k1_ge *)0xffffefffffc2f;
      r_02 = (secp256k1_ge *)0x1000003d1;
      auStack_518._0_8_ = uStack_468 + auStack_518._0_8_;
      auStack_518._8_8_ = uStack_460 + auStack_518._8_8_;
      auStack_518._16_8_ = uStack_458 + auStack_518._16_8_;
      auStack_518._24_8_ = uStack_450 + auStack_518._24_8_;
      auStack_518._32_8_ = auStack_518._32_8_ + uStack_490;
      auStack_518._44_4_ = 0;
      auStack_518._40_4_ = auStack_518._40_4_ + uStack_57c;
      psStack_590 = (secp256k1_ge *)0x14d186;
      secp256k1_fe_verify((secp256k1_fe *)psVar14);
      uStack_4b8 = sStack_368.y.n[4];
      uStack_4b0._0_4_ = sStack_368.y.magnitude;
      uStack_4b0._4_4_ = sStack_368.y.normalized;
      uStack_4c8 = sStack_368.y.n[2];
      uStack_4c0 = sStack_368.y.n[3];
      auStack_518._64_8_ = sStack_368.y.n[0];
      uStack_4d0 = sStack_368.y.n[1];
      r_04 = (secp256k1_ge *)(auStack_518 + 0x40);
      psStack_590 = (secp256k1_ge *)0x14d1c1;
      secp256k1_fe_verify((secp256k1_fe *)r_04);
      a_01 = (secp256k1_ge *)(auStack_448 + 0x30);
      psStack_590 = (secp256k1_ge *)0x14d1ce;
      secp256k1_fe_verify((secp256k1_fe *)a_01);
      uVar6 = uVar6 + (int)uStack_4b0;
      r_01 = (secp256k1_ge *)(ulong)uVar6;
      psVar20 = r_03;
      a_02 = r_04;
      if (0x20 < (int)uVar6) goto LAB_0014d4b0;
      auStack_518._64_8_ = uStack_488 + auStack_518._64_8_;
      uStack_4d0 = uStack_480 + uStack_4d0;
      uStack_4c8 = uStack_478 + uStack_4c8;
      uStack_4c0 = uStack_470 + uStack_4c0;
      uStack_4b8 = (long)(r_03->x).n + uStack_4b8;
      uStack_4b0 = (ulong)uVar6;
      psStack_590 = (secp256k1_ge *)0x14d236;
      secp256k1_fe_verify((secp256k1_fe *)r_04);
      psStack_590 = (secp256k1_ge *)0x14d23e;
      secp256k1_fe_verify((secp256k1_fe *)psVar14);
      uVar23 = ((ulong)auStack_518._32_8_ >> 0x30) * 0x1000003d1 + auStack_518._0_8_;
      if (((uVar23 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar23 & 0xfffffffffffff) == 0)) {
        uVar11 = (uVar23 >> 0x34) + auStack_518._8_8_;
        uVar19 = (uVar11 >> 0x34) + auStack_518._16_8_;
        uVar24 = (uVar19 >> 0x34) + auStack_518._24_8_;
        uVar25 = (uVar24 >> 0x34) + (auStack_518._32_8_ & 0xffffffffffff);
        if ((((uVar11 | uVar23 | uVar19 | uVar24) & 0xfffffffffffff) != 0 || uVar25 != 0) &&
           ((uVar23 + 0x1000003d0 & uVar11 & uVar19 & uVar24 & (uVar25 ^ 0xf000000000000)) !=
            0xfffffffffffff)) goto LAB_0014d3de;
        psStack_590 = (secp256k1_ge *)0x14d30d;
        secp256k1_fe_verify((secp256k1_fe *)r_04);
        uVar23 = (uStack_4b8 >> 0x30) * 0x1000003d1 + auStack_518._64_8_;
        if (((uVar23 & 0xfffffffffffff) != 0xffffefffffc2f) && ((uVar23 & 0xfffffffffffff) != 0))
        goto LAB_0014d3de;
        uVar11 = (uVar23 >> 0x34) + uStack_4d0;
        psVar18 = (secp256k1_ge *)((uVar11 >> 0x34) + uStack_4c8);
        a_01 = (secp256k1_ge *)(((ulong)psVar18 >> 0x34) + uStack_4c0);
        uVar19 = ((ulong)a_01 >> 0x34) + (uStack_4b8 & 0xffffffffffff);
        if ((((uVar11 | uVar23 | (ulong)psVar18 | (ulong)a_01) & 0xfffffffffffff) != 0 ||
             uVar19 != 0) &&
           ((uVar23 + 0x1000003d0 & uVar11 & (ulong)psVar18 & (ulong)a_01 &
            (uVar19 ^ 0xf000000000000)) != 0xfffffffffffff)) goto LAB_0014d3de;
        goto LAB_0014d4c4;
      }
LAB_0014d3de:
      a_02 = (secp256k1_ge *)(auStack_578 + 0x30);
      psVar14 = (secp256k1_ge *)auStack_518;
      psStack_590 = (secp256k1_ge *)0x14d3f6;
      iVar5 = secp256k1_fe_equal((secp256k1_fe *)a_02,(secp256k1_fe *)psVar14);
      r_02 = (secp256k1_ge *)auStack_578;
      if (iVar5 != 0) {
        psStack_590 = (secp256k1_ge *)0x14d40a;
        psVar18 = r_04;
        a_01 = r_02;
        iVar5 = secp256k1_fe_equal((secp256k1_fe *)r_02,(secp256k1_fe *)r_04);
        if (iVar5 == 0) goto LAB_0014d412;
        goto LAB_0014d4ba;
      }
LAB_0014d412:
      psStack_590 = (secp256k1_ge *)0x14d420;
      secp256k1_fe_mul((secp256k1_fe *)a_02,(secp256k1_fe *)a_02,(secp256k1_fe *)r_04);
      psStack_590 = (secp256k1_ge *)0x14d42e;
      secp256k1_fe_mul((secp256k1_fe *)r_02,(secp256k1_fe *)r_02,(secp256k1_fe *)psVar14);
      psStack_590 = (secp256k1_ge *)0x14d439;
      psVar18 = r_02;
      a_01 = a_02;
      iVar5 = secp256k1_fe_equal((secp256k1_fe *)a_02,(secp256k1_fe *)r_02);
      if (iVar5 == 0) goto LAB_0014d4b5;
      psVar18 = &sStack_368;
      psVar14 = &sStack_3d8;
      for (lVar10 = 0xd; lVar10 != 0; lVar10 = lVar10 + -1) {
        (psVar14->x).n[0] = (psVar18->x).n[0];
        psVar18 = (secp256k1_ge *)((long)psVar18 + ((ulong)bVar4 * -2 + 1) * 8);
        psVar14 = (secp256k1_ge *)((long)psVar14 + ((ulong)bVar4 * -2 + 1) * 8);
      }
      r_01 = (secp256k1_ge *)(((secp256k1_fe *)(auStack_518._56_8_ + 0x30))->n + 2);
      if (r_01 == (secp256k1_ge *)0x80000) {
        return;
      }
    }
    psStack_590 = (secp256k1_ge *)0x14d4a1;
    test_pre_g_table_cold_9();
LAB_0014d4a1:
    psStack_590 = (secp256k1_ge *)0x14d4a6;
    test_pre_g_table_cold_8();
LAB_0014d4a6:
    psStack_590 = (secp256k1_ge *)0x14d4ab;
    test_pre_g_table_cold_7();
LAB_0014d4ab:
    psStack_590 = (secp256k1_ge *)0x14d4b0;
    test_pre_g_table_cold_6();
LAB_0014d4b0:
    r_04 = psVar20;
    psStack_590 = (secp256k1_ge *)0x14d4b5;
    test_pre_g_table_cold_5();
LAB_0014d4b5:
    psStack_590 = (secp256k1_ge *)0x14d4ba;
    test_pre_g_table_cold_4();
LAB_0014d4ba:
    psStack_590 = (secp256k1_ge *)0x14d4bf;
    test_pre_g_table_cold_3();
    r_03 = r_04;
    r_04 = a_02;
LAB_0014d4bf:
    psStack_590 = (secp256k1_ge *)0x14d4c4;
    test_pre_g_table_cold_1();
LAB_0014d4c4:
    psStack_590 = (secp256k1_ge *)0x14d4c9;
    test_pre_g_table_cold_2();
  }
  psStack_590 = (secp256k1_ge *)secp256k1_wnaf_fixed;
  test_pre_g_table_cold_10();
  pcStack_5e8 = (code *)0x14d4ed;
  psVar20 = psVar18;
  psStack_5b8 = r_01;
  psStack_5b0 = psVar26;
  psStack_5a8 = r_02;
  psStack_5a0 = r_03;
  psStack_598 = r_04;
  psStack_590 = psVar14;
  secp256k1_scalar_verify((secp256k1_scalar *)psVar18);
  auVar31._0_4_ = -(uint)((int)(psVar18->x).n[2] == 0 && (int)(psVar18->x).n[0] == 0);
  auVar31._4_4_ =
       -(uint)(*(int *)((long)(psVar18->x).n + 0x14) == 0 && *(int *)((long)(psVar18->x).n + 4) == 0
              );
  auVar31._8_4_ = -(uint)((int)(psVar18->x).n[3] == 0 && (int)(psVar18->x).n[1] == 0);
  auVar31._12_4_ =
       -(uint)(*(int *)((long)(psVar18->x).n + 0x1c) == 0 &&
              *(int *)((long)(psVar18->x).n + 0xc) == 0);
  iVar5 = movmskps(extraout_EAX,auVar31);
  if (iVar5 == 0xf) {
    if (-1 < (int)(0x7f / (long)(int)extraout_EDX)) {
      pcStack_5e8 = (code *)0x14d5e7;
      memset(a_01,0,(0x7f / (long)(int)extraout_EDX & 0xffffffffU) * 4 + 4);
    }
    return;
  }
  pcStack_5e8 = (code *)0x14d51a;
  secp256k1_scalar_verify((secp256k1_scalar *)psVar18);
  uVar6 = (uint)(psVar18->x).n[0];
  pcStack_5e8 = (code *)0x14d526;
  psVar14 = psVar18;
  secp256k1_scalar_verify((secp256k1_scalar *)psVar18);
  if (0xffffffdf < extraout_EDX - 0x21) {
    uVar6 = ~uVar6 & 1;
    pcStack_5e8 = (code *)0x14d544;
    secp256k1_scalar_verify((secp256k1_scalar *)psVar18);
    bVar9 = (byte)extraout_EDX;
    *(uint *)(a_01->x).n =
         ((uint)((int)(psVar18->x).n[extraout_EDX - 1 >> 6] << (-bVar9 & 0x1f)) >> (-bVar9 & 0x1f))
         + uVar6;
    bVar4 = 0x7f / bVar9;
    uStack_5c0 = (ulong)bVar4;
    uVar13 = (uint)bVar4;
    uVar27 = 0x80 - bVar4 * extraout_EDX;
    uVar23 = uStack_5c0;
    uStack_5d4 = uVar6;
    psStack_5c8 = psVar18;
    do {
      uVar6 = extraout_EDX;
      if (uVar23 == uStack_5c0) {
        uVar6 = uVar27;
      }
      pcStack_5e8 = (code *)0x14d59f;
      uVar7 = secp256k1_scalar_get_bits_var
                        ((secp256k1_scalar *)psStack_5c8,(uint)uVar23 * extraout_EDX,uVar6);
      uVar6 = (uint)uVar23;
      if (uVar7 != 0) break;
      *(undefined4 *)((long)(a_01->x).n + uVar23 * 4) = 0;
      uVar13 = uVar13 - 1;
      bVar30 = 1 < (long)uVar23;
      uVar23 = uVar23 - 1;
      uVar6 = uVar13;
    } while (bVar30);
    if ((int)uVar6 < 1) {
      return;
    }
    iStack_5d0 = -1 << (bVar9 & 0x1f);
    iStack_5cc = 1 << (bVar9 & 0x1f);
    uVar23 = 1;
    uVar13 = extraout_EDX;
    do {
      count = extraout_EDX;
      if (uStack_5c0 == uVar23) {
        count = uVar27;
      }
      pcStack_5e8 = (code *)0x14d63c;
      uVar7 = secp256k1_scalar_get_bits_var((secp256k1_scalar *)psStack_5c8,uVar13,count);
      if ((uVar7 & 1) == 0) {
        piVar3 = (int *)((long)(a_01->x).n + uVar23 * 4 + -4);
        *piVar3 = *piVar3 + iStack_5d0;
        uVar7 = uVar7 | 1;
      }
      *(uint32_t *)((long)(a_01->x).n + uVar23 * 4) = uVar7;
      if (1 < uVar23) {
        iVar5 = *(int *)((long)(a_01->x).n + uVar23 * 4 + -4);
        if (iVar5 == -1) {
          iVar5 = *(int *)((long)(a_01->x).n + uVar23 * 4 + -8);
          if (0 < iVar5) {
            iVar5 = iVar5 + iStack_5d0;
            goto LAB_0014d681;
          }
        }
        else if ((iVar5 == 1) && (iVar5 = *(int *)((long)(a_01->x).n + uVar23 * 4 + -8), iVar5 < 0))
        {
          iVar5 = iVar5 + iStack_5cc;
LAB_0014d681:
          *(int *)((long)(a_01->x).n + uVar23 * 4 + -8) = iVar5;
          *(undefined4 *)((long)(a_01->x).n + uVar23 * 4 + -4) = 0;
        }
      }
      uVar23 = uVar23 + 1;
      uVar13 = uVar13 + extraout_EDX;
      if (uVar6 + 1 == uVar23) {
        return;
      }
    } while( true );
  }
  pcStack_5e8 = test_fixed_wnaf_small_helper;
  secp256k1_wnaf_fixed_cold_1();
  uVar23 = 0x20;
  do {
    uVar13 = (int)uVar23 - 1;
    uVar23 = (ulong)uVar13;
    if (*(int *)((long)(psVar14->x).n + uVar23 * 4) != 0) {
      pcStack_5f0 = (code *)0x14d6e2;
      test_fixed_wnaf_small_helper_cold_1();
      goto LAB_0014d6e2;
    }
  } while (8 < uVar13);
  uVar13 = 7;
  while (*(int *)((long)(psVar14->x).n + (ulong)uVar13 * 4) ==
         *(int *)((long)(psVar20->x).n + (ulong)uVar13 * 4)) {
    bVar30 = uVar13 == 0;
    uVar13 = uVar13 - 1;
    if (bVar30) {
      return;
    }
  }
LAB_0014d6e2:
  pcStack_5f0 = test_ecmult_target;
  test_fixed_wnaf_small_helper_cold_2();
  psVar17 = (secp256k1_gej *)auStack_1210;
  psVar15 = (secp256k1_strauss_point_state *)((ulong)psVar20 & 0xffffffff);
  psVar28 = (secp256k1_scalar *)auStack_11f0;
  psStack_1218 = (secp256k1_strauss_point_state *)0x14d70a;
  psStack_618 = a_01;
  psStack_610 = psVar18;
  psStack_608 = r_02;
  uStack_600 = (ulong)extraout_EDX;
  psStack_5f8 = r_04;
  pcStack_5f0 = (code *)(ulong)uVar6;
  testutil_random_scalar_order_test(psVar28);
  psStack_1218 = (secp256k1_strauss_point_state *)0x14d71b;
  secp256k1_scalar_add((secp256k1_scalar *)auStack_1210,psVar28,(secp256k1_scalar *)psVar14);
  psStack_1218 = (secp256k1_strauss_point_state *)0x14d726;
  secp256k1_scalar_negate((secp256k1_scalar *)auStack_1210,(secp256k1_scalar *)auStack_1210);
  if ((int)psVar20 == 0) {
    psStack_1218 = (secp256k1_strauss_point_state *)0x14d81f;
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&sStack_1088,(secp256k1_scalar *)auStack_11f0);
    psStack_1218 = (secp256k1_strauss_point_state *)0x14d836;
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&sStack_1120,(secp256k1_scalar *)auStack_1210);
    psStack_1218 = (secp256k1_strauss_point_state *)0x14d84a;
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&sStack_11b8,(secp256k1_scalar *)psVar14);
  }
  else {
    psStack_1218 = (secp256k1_strauss_point_state *)0x14d73e;
    testutil_random_ge_test(&sStack_ff0);
    psStack_1218 = (secp256k1_strauss_point_state *)0x14d74e;
    secp256k1_gej_set_ge(&sStack_f88,&sStack_ff0);
    if ((int)psVar20 == 1) {
      psVar18 = asStack_ef0;
      r_02 = asStack_d70;
      psVar15 = &sStack_a30;
      psVar28 = &secp256k1_scalar_zero;
      psStack_1218 = (secp256k1_strauss_point_state *)0x14d7ae;
      sStack_1120.x.n[0] = (uint64_t)psVar18;
      sStack_1120.x.n[1] = (uint64_t)r_02;
      sStack_1120.x.n[2] = (uint64_t)psVar15;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&sStack_1120,&sStack_1088,1,&sStack_f88,
                 (secp256k1_scalar *)auStack_11f0,&secp256k1_scalar_zero);
      psStack_1218 = (secp256k1_strauss_point_state *)0x14d7d9;
      sStack_11b8.x.n[0] = (uint64_t)psVar18;
      sStack_11b8.x.n[1] = (uint64_t)r_02;
      sStack_11b8.x.n[2] = (uint64_t)psVar15;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&sStack_11b8,&sStack_1120,1,&sStack_f88,
                 (secp256k1_scalar *)auStack_1210,&secp256k1_scalar_zero);
      psStack_1218 = (secp256k1_strauss_point_state *)0x14d801;
      auStack_11f0._32_8_ = psVar18;
      psStack_11c8 = r_02;
      psStack_11c0 = psVar15;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)(auStack_11f0 + 0x20),&sStack_11b8,1,&sStack_f88,
                 (secp256k1_scalar *)psVar14,&secp256k1_scalar_zero);
      psVar17 = &sStack_f88;
    }
    else {
      psVar28 = (secp256k1_scalar *)&sStack_ff0;
      psStack_1218 = (secp256k1_strauss_point_state *)0x14d869;
      secp256k1_ecmult_const(&sStack_1088,(secp256k1_ge *)psVar28,(secp256k1_scalar *)auStack_11f0);
      psStack_1218 = (secp256k1_strauss_point_state *)0x14d87c;
      secp256k1_ecmult_const(&sStack_1120,(secp256k1_ge *)psVar28,(secp256k1_scalar *)auStack_1210);
      psStack_1218 = (secp256k1_strauss_point_state *)0x14d88c;
      secp256k1_ecmult_const(&sStack_11b8,(secp256k1_ge *)psVar28,(secp256k1_scalar *)psVar14);
      psVar17 = (secp256k1_gej *)auStack_1210;
    }
  }
  psStack_1218 = (secp256k1_strauss_point_state *)0x14d8a6;
  secp256k1_gej_add_var(&sStack_11b8,&sStack_11b8,&sStack_1088,(secp256k1_fe *)0x0);
  psStack_1218 = (secp256k1_strauss_point_state *)0x14d8bb;
  psVar21 = &sStack_11b8;
  secp256k1_gej_add_var(&sStack_11b8,&sStack_11b8,&sStack_1120,(secp256k1_fe *)0x0);
  psStack_1218 = (secp256k1_strauss_point_state *)0x14d8c3;
  psVar22 = &sStack_11b8;
  secp256k1_gej_verify(&sStack_11b8);
  if (sStack_11b8.infinity != 0) {
    return;
  }
  psStack_1218 = (secp256k1_strauss_point_state *)test_ecmult_constants_sha;
  test_ecmult_target_cold_1();
  out32 = (uchar *)((ulong)psVar22 & 0xffffffff);
  pcStack_1380 = (code *)0x14d911;
  psStack_1368 = psVar21;
  lStack_1360 = extraout_RDX;
  psStack_1240 = &sStack_11b8;
  psStack_1238 = psVar18;
  psStack_1230 = r_02;
  psStack_1228 = (secp256k1_ge *)psVar28;
  psStack_1220 = psVar17;
  psStack_1218 = psVar15;
  scratch = secp256k1_scratch_space_create(CTX,0x10000);
  uStack_136e = SUB84(psVar22,0);
  psVar29 = &sStack_12a8;
  sStack_12a8.s[0] = 0x6a09e667;
  sStack_12a8.s[1] = 0xbb67ae85;
  sStack_12a8.s[2] = 0x3c6ef372;
  sStack_12a8.s[3] = 0xa54ff53a;
  sStack_12a8.s[4] = 0x510e527f;
  sStack_12a8.s[5] = 0x9b05688c;
  sStack_12a8.s[6] = 0x1f83d9ab;
  sStack_12a8.s[7] = 0x5be0cd19;
  psVar21 = (secp256k1_gej *)0x0;
  sStack_12a8.bytes = 0;
  psVar28 = (secp256k1_scalar *)(auStack_1358 + 0x20);
  auStack_1358._32_8_ = 0;
  uStack_1330._0_4_ = 0;
  uStack_1330._4_4_ = 0;
  uStack_1328 = 0;
  uStack_1320 = 0;
  pcStack_1380 = (code *)0x14d95b;
  secp256k1_scalar_verify(psVar28);
  pcStack_1380 = (code *)0x14d969;
  test_ecmult_accumulate(psVar29,psVar28,scratch);
  auStack_1358._32_8_ = 1;
  uStack_1330._0_4_ = 0;
  uStack_1330._4_4_ = 0;
  uStack_1328 = 0;
  uStack_1320 = 0;
  pcStack_1380 = (code *)0x14d985;
  secp256k1_scalar_verify(psVar28);
  pcStack_1380 = (code *)0x14d993;
  test_ecmult_accumulate(psVar29,psVar28,scratch);
  pcStack_1380 = (code *)0x14d99e;
  secp256k1_scalar_negate(psVar28,psVar28);
  pcStack_1380 = (code *)0x14d9af;
  test_ecmult_accumulate(psVar29,psVar28,scratch);
  psVar17 = psStack_1368;
  if (psStack_1368 != (secp256k1_gej *)0x0) {
    psVar21 = (secp256k1_gej *)0x0;
    psVar29 = &sStack_1318;
    out32 = auStack_1358;
    do {
      uStack_136a = SUB82(psVar21,0);
      sStack_1318.s[0] = 0x6a09e667;
      sStack_1318.s[1] = 0xbb67ae85;
      sStack_1318.s[2] = 0x3c6ef372;
      sStack_1318.s[3] = 0xa54ff53a;
      sStack_1318.s[4] = 0x510e527f;
      sStack_1318.s[5] = 0x9b05688c;
      sStack_1318.s[6] = 0x1f83d9ab;
      sStack_1318.s[7] = 0x5be0cd19;
      sStack_1318.bytes = 0;
      pcStack_1380 = (code *)0x14da0b;
      secp256k1_sha256_write(psVar29,(uchar *)&uStack_136e,6);
      pcStack_1380 = (code *)0x14da16;
      secp256k1_sha256_finalize(psVar29,out32);
      pcStack_1380 = (code *)0x14da23;
      secp256k1_scalar_set_b32((secp256k1_scalar *)(auStack_1358 + 0x20),out32,(int *)0x0);
      pcStack_1380 = (code *)0x14da36;
      test_ecmult_accumulate(&sStack_12a8,(secp256k1_scalar *)(auStack_1358 + 0x20),scratch);
      psVar21 = (secp256k1_gej *)((long)(psVar21->x).n + 1);
    } while (psVar17 != psVar21);
  }
  hash = &sStack_12a8;
  psVar18 = (secp256k1_ge *)auStack_1358;
  pcStack_1380 = (code *)0x14da50;
  secp256k1_sha256_finalize(hash,(uchar *)psVar18);
  lVar10 = 0;
  while (auStack_1358[lVar10] == *(char *)(lStack_1360 + lVar10)) {
    lVar10 = lVar10 + 1;
    if (lVar10 == 0x20) {
      pcStack_1380 = (code *)0x14da78;
      secp256k1_scratch_space_destroy(CTX,scratch);
      return;
    }
  }
  pcStack_1380 = test_ecmult_accumulate;
  test_ecmult_constants_sha_cold_1();
  psStack_1388 = psVar17;
  auStack_2030 = (undefined1  [8])0x41;
  psStack_2048 = (secp256k1_scalar *)0x14dac8;
  psStack_13a8 = scratch;
  psStack_13a0 = psVar29;
  puStack_1398 = auStack_1358 + 0x20;
  psStack_1390 = psVar21;
  pcStack_1380 = (code *)out32;
  secp256k1_gej_set_ge(&sStack_1e48,&secp256k1_ge_const_g);
  psStack_2048 = (secp256k1_scalar *)0x14dad5;
  secp256k1_gej_set_infinity(&sStack_1ee0);
  psStack_2048 = (secp256k1_scalar *)0x14daec;
  secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&sStack_1db0 + 1,(secp256k1_scalar *)psVar18);
  psVar15 = (secp256k1_strauss_point_state *)(asStack_1b00[5].y.n + 3);
  psStack_2048 = (secp256k1_scalar *)0x14db3e;
  sStack_1f78.x.n[0] = (uint64_t)asStack_1c80;
  sStack_1f78.x.n[1] = (uint64_t)asStack_1b00;
  sStack_1f78.x.n[2] = (uint64_t)psVar15;
  secp256k1_ecmult_strauss_wnaf
            ((secp256k1_strauss_state *)&sStack_1f78,&sStack_1db0,1,&sStack_1e48,
             (secp256k1_scalar *)psVar18,&secp256k1_scalar_zero);
  psStack_2048 = (secp256k1_scalar *)0x14db6e;
  auStack_2028._0_8_ = asStack_1c80;
  auStack_2028._8_8_ = asStack_1b00;
  auStack_2028._16_8_ = psVar15;
  secp256k1_ecmult_strauss_wnaf
            ((secp256k1_strauss_state *)auStack_2028,&sStack_1f78,1,&sStack_1ee0,
             &secp256k1_scalar_zero,(secp256k1_scalar *)psVar18);
  error_callback = (secp256k1_callback *)0xd0;
  psVar17 = (secp256k1_gej *)&CTX->error_callback;
  cb = (secp256k1_ecmult_multi_callback *)0x0;
  psVar26 = (secp256k1_ge *)0x0;
  psStack_2048 = (secp256k1_scalar *)0x14db9f;
  psVar28 = (secp256k1_scalar *)psVar18;
  psVar14 = scratch_00;
  iVar5 = secp256k1_ecmult_multi_var
                    ((secp256k1_callback *)psVar17,(secp256k1_scratch *)scratch_00,
                     (secp256k1_gej *)(asStack_1b00[5].y.n + 3),(secp256k1_scalar *)psVar18,
                     (secp256k1_ecmult_multi_callback *)0x0,(void *)0x0,0);
  if (iVar5 == 0) {
    psStack_2048 = (secp256k1_scalar *)0x14dd04;
    test_ecmult_accumulate_cold_8();
LAB_0014dd04:
    psStack_2048 = (secp256k1_scalar *)0x14dd09;
    test_ecmult_accumulate_cold_7();
LAB_0014dd09:
    psStack_2048 = (secp256k1_scalar *)0x14dd0e;
    test_ecmult_accumulate_cold_6();
LAB_0014dd0e:
    psStack_2048 = (secp256k1_scalar *)0x14dd13;
    test_ecmult_accumulate_cold_5();
LAB_0014dd13:
    psStack_2048 = (secp256k1_scalar *)0x14dd18;
    test_ecmult_accumulate_cold_4();
LAB_0014dd18:
    psStack_2048 = (secp256k1_scalar *)0x14dd1d;
    test_ecmult_accumulate_cold_3();
LAB_0014dd1d:
    psStack_2048 = (secp256k1_scalar *)0x14dd22;
    test_ecmult_accumulate_cold_2();
  }
  else {
    error_callback = &CTX->error_callback;
    psVar28 = &secp256k1_scalar_zero;
    cb = test_ecmult_accumulate_cb;
    psStack_2048 = (secp256k1_scalar *)0x14dbda;
    psVar14 = scratch_00;
    psVar17 = (secp256k1_gej *)error_callback;
    psVar26 = psVar18;
    iVar5 = secp256k1_ecmult_multi_var
                      (error_callback,(secp256k1_scratch *)scratch_00,asStack_1b00,
                       &secp256k1_scalar_zero,test_ecmult_accumulate_cb,psVar18,1);
    if (iVar5 == 0) goto LAB_0014dd04;
    psStack_2048 = (secp256k1_scalar *)0x14dbf9;
    secp256k1_ecmult_const(asStack_1c80,&secp256k1_ge_const_g,(secp256k1_scalar *)psVar18);
    psVar18 = (secp256k1_ge *)auStack_2028;
    psStack_2048 = (secp256k1_scalar *)0x14dc0e;
    secp256k1_ge_set_gej_var(psVar18,&sStack_1db0 + 1);
    psVar17 = &sStack_1db0;
    psStack_2048 = (secp256k1_scalar *)0x14dc1e;
    psVar14 = psVar18;
    iVar5 = secp256k1_gej_eq_ge_var(psVar17,psVar18);
    if (iVar5 == 0) goto LAB_0014dd09;
    psVar17 = &sStack_1f78;
    psVar14 = (secp256k1_ge *)auStack_2028;
    psStack_2048 = (secp256k1_scalar *)0x14dc38;
    iVar5 = secp256k1_gej_eq_ge_var(psVar17,psVar14);
    if (iVar5 == 0) goto LAB_0014dd0e;
    psVar17 = (secp256k1_gej *)(asStack_1b00[5].y.n + 3);
    psVar14 = (secp256k1_ge *)auStack_2028;
    psStack_2048 = (secp256k1_scalar *)0x14dc52;
    iVar5 = secp256k1_gej_eq_ge_var(psVar17,psVar14);
    if (iVar5 == 0) goto LAB_0014dd13;
    psVar17 = asStack_1b00;
    psVar14 = (secp256k1_ge *)auStack_2028;
    psStack_2048 = (secp256k1_scalar *)0x14dc6c;
    iVar5 = secp256k1_gej_eq_ge_var(psVar17,psVar14);
    if (iVar5 == 0) goto LAB_0014dd18;
    psVar17 = asStack_1c80;
    psVar14 = (secp256k1_ge *)auStack_2028;
    psStack_2048 = (secp256k1_scalar *)0x14dc86;
    iVar5 = secp256k1_gej_eq_ge_var(psVar17,psVar14);
    if (iVar5 == 0) goto LAB_0014dd1d;
    psStack_2048 = (secp256k1_scalar *)0x14dc9b;
    secp256k1_ge_verify((secp256k1_ge *)auStack_2028);
    if (auStack_2028._96_4_ != 0) {
      auStack_2028[0x68] = 0;
      sVar12 = 1;
LAB_0014dce3:
      psStack_2048 = (secp256k1_scalar *)0x14dced;
      secp256k1_sha256_write(hash,auStack_2028 + 0x68,sVar12);
      return;
    }
    psVar17 = (secp256k1_gej *)auStack_2028;
    psVar14 = (secp256k1_ge *)(auStack_2028 + 0x68);
    psVar18 = (secp256k1_ge *)auStack_2030;
    psVar28 = (secp256k1_scalar *)0x0;
    psStack_2048 = (secp256k1_scalar *)0x14dcd0;
    secp256k1_eckey_pubkey_serialize((secp256k1_ge *)psVar17,(uchar *)psVar14,(size_t *)psVar18,0);
    if (auStack_2030 == (undefined1  [8])0x41) {
      sVar12 = 0x41;
      goto LAB_0014dce3;
    }
  }
  psStack_2048 = (secp256k1_scalar *)secp256k1_ecmult_multi_var;
  test_ecmult_accumulate_cold_1();
  psStack_2048 = &secp256k1_scalar_zero;
  psStack_2070 = asStack_1c80;
  psStack_2068 = error_callback;
  psStack_2058 = psVar18;
  psStack_2050 = psVar15;
  secp256k1_gej_set_infinity(r_00);
  if ((secp256k1_ge *)psVar28 != (secp256k1_ge *)0x0 || hash != (secp256k1_sha256 *)0x0) {
    if (hash == (secp256k1_sha256 *)0x0) {
      sStack_2960.aux = asStack_2538;
      sStack_2960.pre_a = asStack_23b8;
      sStack_2960.ps = &sStack_2948;
      secp256k1_ecmult_strauss_wnaf(&sStack_2960,r_00,1,r_00,&secp256k1_scalar_zero,psVar28);
    }
    else {
      if ((psVar14 == (secp256k1_ge *)0x0) ||
         (sVar12 = secp256k1_pippenger_max_points
                             ((secp256k1_callback *)psVar17,(secp256k1_scratch *)psVar14),
         sVar12 == 0)) {
LAB_0014df51:
        secp256k1_ecmult_multi_simple_var(r_00,psVar28,cb,psVar26,(size_t)hash);
        return;
      }
      uVar23 = 5000000;
      if (sVar12 < 5000000) {
        uVar23 = sVar12;
      }
      puVar2 = (undefined1 *)((long)&hash[-1].bytes + 7);
      uStack_2968 = (ulong)puVar2 / uVar23 + 1;
      uVar23 = (ulong)puVar2 / uStack_2968;
      if (uVar23 < 0x57) {
        lVar10 = 0;
        do {
          if (*(char *)((long)(psVar14->x).n + lVar10) != "scratch"[lVar10]) {
            (*(code *)(psVar17->x).n[0])("invalid scratch space",(psVar17->x).n[1]);
            goto LAB_0014df51;
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 != 8);
        uVar11 = (psVar14->x).n[3] - (psVar14->x).n[2];
        uVar23 = 0;
        if (0x4a < uVar11) {
          uVar23 = uVar11 - 0x4b;
        }
        if (uVar23 < 0x988) goto LAB_0014df51;
        uVar23 = uVar23 / 0x988;
        if (4999999 < uVar23) {
          uVar23 = 5000000;
        }
        uStack_2968 = (ulong)puVar2 / uVar23 + 1;
        uVar23 = (ulong)puVar2 / uStack_2968;
        pcVar8 = secp256k1_ecmult_strauss_batch;
      }
      else {
        pcVar8 = secp256k1_ecmult_pippenger_batch;
      }
      psVar29 = (secp256k1_sha256 *)(uVar23 + 1);
      lVar10 = 0;
      uVar23 = 0;
      do {
        psVar16 = psVar29;
        if (hash < psVar29) {
          psVar16 = hash;
        }
        psVar18 = (secp256k1_ge *)0x0;
        if (uVar23 == 0) {
          psVar18 = (secp256k1_ge *)psVar28;
        }
        iVar5 = (*pcVar8)(psVar17,psVar14,&sStack_2948,psVar18,cb,psVar26,psVar16,lVar10);
        if (iVar5 == 0) {
          return;
        }
        secp256k1_gej_add_var(r_00,r_00,(secp256k1_gej *)&sStack_2948,(secp256k1_fe *)0x0);
        hash = (secp256k1_sha256 *)((long)hash - (long)psVar16);
        uVar23 = uVar23 + 1;
        lVar10 = (long)psVar29->s + lVar10;
      } while (uStack_2968 != uVar23);
    }
  }
  return;
}

Assistant:

static void test_gej_cmov(const secp256k1_gej *a, const secp256k1_gej *b) {
    secp256k1_gej t = *a;
    secp256k1_gej_cmov(&t, b, 0);
    CHECK(gej_xyz_equals_gej(&t, a));
    secp256k1_gej_cmov(&t, b, 1);
    CHECK(gej_xyz_equals_gej(&t, b));
}